

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O1

void __thiscall libtorrent::alerts_dropped_alert::~alerts_dropped_alert(alerts_dropped_alert *this)

{
  operator_delete(this,0x20);
  return;
}

Assistant:

struct TORRENT_EXPORT alerts_dropped_alert final : alert
	{
		// internal
		explicit alerts_dropped_alert(aux::stack_allocator& alloc
			, std::bitset<num_alert_types> const&);
		TORRENT_DEFINE_ALERT_PRIO(alerts_dropped_alert, 95, alert_priority_critical + 1)

		static constexpr alert_category_t static_category = alert_category::error;
		std::string message() const override;

		// a bitmask indicating which alerts were dropped. Each bit represents the
		// alert type ID, where bit 0 represents whether any alert of type 0 has
		// been dropped, and so on.
		std::bitset<num_alert_types> dropped_alerts;
	}